

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O1

_outconnect *
obj_nexttraverseoutlet(_outconnect *lastconnect,t_object **destp,_inlet **inletp,int *whichp)

{
  t_object *ptVar1;
  _class *p_Var2;
  t_object *ptVar3;
  _inlet *i;
  int iVar4;
  t_object *ptVar5;
  
  ptVar1 = (t_object *)lastconnect->oc_to;
  p_Var2 = (ptVar1->te_g).g_pd;
  if ((((p_Var2 == inlet_class) || (p_Var2 == pointerinlet_class)) || (p_Var2 == floatinlet_class))
     || (p_Var2 == symbolinlet_class)) {
    ptVar3 = (t_object *)ptVar1->te_binbuf;
    ptVar5 = (t_object *)ptVar3->te_inlet;
    iVar4 = (int)((ptVar3->te_g).g_pd)->c_firstin;
    if (ptVar5 != ptVar1 && ptVar5 != (t_object *)0x0) {
      do {
        iVar4 = iVar4 + 1;
        ptVar5 = (t_object *)(ptVar5->te_g).g_next;
        if (ptVar5 == (t_object *)0x0) break;
      } while (ptVar5 != ptVar1);
    }
    *whichp = iVar4;
    *destp = ptVar3;
    destp = (t_object **)inletp;
  }
  else {
    *whichp = 0;
    *inletp = (_inlet *)0x0;
  }
  *destp = ptVar1;
  return lastconnect->oc_next;
}

Assistant:

t_outconnect *obj_nexttraverseoutlet(t_outconnect *lastconnect,
    t_object **destp, t_inlet **inletp, int *whichp)
{
    t_pd *y;
    y = lastconnect->oc_to;
    if (ISINLET(y))
    {
        int n;
        t_inlet *i = (t_inlet *)y, *i2;
        t_object *dest = i->i_owner;
        for (n = dest->ob_pd->c_firstin, i2 = dest->ob_inlet;
            i2 && i2 != i; i2 = i2->i_next) n++;
        *whichp = n;
        *destp = dest;
        *inletp = i;
    }
    else
    {
        *whichp = 0;
        *inletp = 0;
        *destp = ((t_object *)y);
    }
    return (lastconnect->oc_next);
}